

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_int_scan.cpp
# Opt level: O3

LOs __thiscall Omega_h::offset_scan<signed_char>(Omega_h *this,Read<signed_char> *a,string *name)

{
  int *piVar1;
  Alloc **ppAVar2;
  char *pcVar3;
  undefined8 uVar4;
  long *plVar5;
  ulong *puVar6;
  void *extraout_RDX;
  size_t sVar7;
  long lVar8;
  int iVar9;
  Alloc *pAVar10;
  LOs LVar11;
  ScopedTimer omega_h_scoped_function_timer;
  Write<int> out;
  string __str;
  ScopedTimer local_c9;
  Write<int> local_c8;
  Alloc local_b8;
  Alloc **local_70;
  long local_68;
  Alloc *local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_int_scan.cpp"
             ,"");
  plVar5 = (long *)std::__cxx11::string::append((char *)local_50);
  ppAVar2 = &local_b8.prev;
  puVar6 = (ulong *)(plVar5 + 2);
  if ((Alloc **)*plVar5 == (Alloc **)puVar6) {
    local_b8.prev = (Alloc *)*puVar6;
    local_b8.next = (Alloc *)plVar5[3];
    local_b8.ptr = ppAVar2;
  }
  else {
    local_b8.prev = (Alloc *)*puVar6;
    local_b8.ptr = (Alloc **)*plVar5;
  }
  local_b8._48_8_ = plVar5[1];
  *plVar5 = (long)puVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,'\x02');
  *(undefined2 *)local_70 = 0x3231;
  pAVar10 = (Alloc *)0xf;
  if ((Alloc **)local_b8.ptr != ppAVar2) {
    pAVar10 = local_b8.prev;
  }
  if (pAVar10 < (Alloc *)(local_68 + local_b8._48_8_)) {
    pAVar10 = (Alloc *)0xf;
    if (local_70 != local_60) {
      pAVar10 = local_60[0];
    }
    if ((Alloc *)(local_68 + local_b8._48_8_) <= pAVar10) {
      plVar5 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_70,0,(char *)0x0,(ulong)local_b8.ptr);
      goto LAB_002f011d;
    }
  }
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_b8.ptr,(ulong)local_70);
LAB_002f011d:
  local_c8.shared_alloc_.alloc = &local_b8;
  pAVar10 = (Alloc *)(plVar5 + 2);
  if ((Alloc *)*plVar5 == pAVar10) {
    local_b8.size = pAVar10->size;
    local_b8.name._M_dataplus._M_p = (pointer)plVar5[3];
  }
  else {
    local_b8.size = pAVar10->size;
    local_c8.shared_alloc_.alloc = (Alloc *)*plVar5;
  }
  local_c8.shared_alloc_.direct_ptr = (void *)plVar5[1];
  *plVar5 = (long)pAVar10;
  plVar5[1] = 0;
  *(undefined1 *)&pAVar10->size = 0;
  begin_code("offset_scan",(char *)local_c8.shared_alloc_.alloc);
  if (local_c8.shared_alloc_.alloc != &local_b8) {
    operator_delete(local_c8.shared_alloc_.alloc,local_b8.size + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,(ulong)((long)&local_60[0]->size + 1));
  }
  if ((Alloc **)local_b8.ptr != ppAVar2) {
    operator_delete(local_b8.ptr,(ulong)((long)&(local_b8.prev)->size + 1));
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  pAVar10 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar10 & 1) == 0) {
    iVar9 = (int)pAVar10->size;
  }
  else {
    iVar9 = (int)((ulong)pAVar10 >> 3);
  }
  Write<int>::Write(&local_c8,iVar9 + 1,name);
  Write<int>::set(&local_c8,0,0);
  pAVar10 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar10 & 1) == 0) {
    sVar7 = pAVar10->size;
  }
  else {
    sVar7 = (ulong)pAVar10 >> 3;
  }
  if (0 < (long)(int)sVar7) {
    pcVar3 = (char *)(a->write_).shared_alloc_.direct_ptr;
    iVar9 = (int)*pcVar3;
    *(int *)((long)local_c8.shared_alloc_.direct_ptr + 4) = iVar9;
    if ((sVar7 & 0xffffffff) != 1) {
      lVar8 = 0;
      do {
        iVar9 = iVar9 + pcVar3[lVar8 + 1];
        *(int *)((long)local_c8.shared_alloc_.direct_ptr + lVar8 * 4 + 8) = iVar9;
        lVar8 = lVar8 + 1;
      } while ((long)(int)sVar7 + -1 != lVar8);
    }
  }
  local_b8.name.field_2._M_allocated_capacity = (size_type)local_c8.shared_alloc_.alloc;
  local_b8.name.field_2._8_8_ = local_c8.shared_alloc_.direct_ptr;
  if ((((ulong)local_c8.shared_alloc_.alloc & 7) == 0 &&
       local_c8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_c8.shared_alloc_.alloc)->use_count = (local_c8.shared_alloc_.alloc)->use_count + -1;
    local_b8.name.field_2._M_allocated_capacity = (local_c8.shared_alloc_.alloc)->size * 8 + 1;
  }
  local_c8.shared_alloc_.alloc = (Alloc *)0x0;
  local_c8.shared_alloc_.direct_ptr = (void *)0x0;
  Read<int>::Read((Read<signed_char> *)this,(Write<int> *)&local_b8.name.field_2);
  uVar4 = local_b8.name.field_2._M_allocated_capacity;
  if ((local_b8.name.field_2._M_allocated_capacity & 7) == 0 &&
      (Alloc *)local_b8.name.field_2._M_allocated_capacity != (Alloc *)0x0) {
    piVar1 = (int *)(local_b8.name.field_2._M_allocated_capacity + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_b8.name.field_2._M_allocated_capacity);
      operator_delete((void *)uVar4,0x48);
    }
  }
  pAVar10 = local_c8.shared_alloc_.alloc;
  if (((ulong)local_c8.shared_alloc_.alloc & 7) == 0 && local_c8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_c8.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_c8.shared_alloc_.alloc);
      operator_delete(pAVar10,0x48);
    }
  }
  ScopedTimer::~ScopedTimer(&local_c9);
  LVar11.write_.shared_alloc_.direct_ptr = extraout_RDX;
  LVar11.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar11.write_.shared_alloc_;
}

Assistant:

LOs offset_scan(Read<T> a, std::string const& name) {
  OMEGA_H_TIME_FUNCTION;
  Write<LO> out(a.size() + 1, name);
  out.set(0, 0);
  auto const first = CastIterator<LO, T>(a.begin());
  auto const last = CastIterator<LO, T>(a.end());
  auto const result = out.begin() + 1;
  inclusive_scan(first, last, result);
  return out;
}